

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::Matcher<const_solitaire::geometry::Area_&>::Matcher
          (Matcher<const_solitaire::geometry::Area_&> *this,Area *value)

{
  Position PVar1;
  Size SVar2;
  MatcherBase<const_solitaire::geometry::Area_&> local_38;
  
  (this->super_MatcherBase<const_solitaire::geometry::Area_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_solitaire::geometry::Area_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_0032c008;
  PVar1 = value->position;
  SVar2 = value->size;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032bfb0;
  local_38.vtable_ =
       (VTable *)
       internal::MatcherBase<solitaire::geometry::Area_const&>::
       GetVTable<testing::internal::MatcherBase<solitaire::geometry::Area_const&>::ValuePolicy<testing::internal::EqMatcher<solitaire::geometry::Area>,false>>()
       ::kVTable;
  local_38.buffer_.ptr = operator_new(0x14);
  ((local_38.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(Position *)(local_38.buffer_.i + 4) = PVar1;
  *(Size *)(local_38.buffer_.i + 0xc) = SVar2;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032c008;
  internal::MatcherBase<const_solitaire::geometry::Area_&>::operator=
            (&this->super_MatcherBase<const_solitaire::geometry::Area_&>,&local_38);
  internal::MatcherBase<const_solitaire::geometry::Area_&>::~MatcherBase(&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }